

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

QByteArray * makePattern(QByteArray *value)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  char *pcVar4;
  char *pcVar5;
  __off_t __length;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  char c_1;
  int h;
  int i;
  char c;
  char *e;
  char *p;
  char *data;
  QByteArray *pattern;
  QByteArray *in_stack_ffffffffffffff80;
  QByteArray *this;
  QByteArray *in_stack_ffffffffffffffa8;
  char local_4d;
  int local_48;
  char local_41;
  char *local_38;
  char *local_20;
  
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QByteArray::size(in_RSI);
  QByteArray::QByteArray
            (in_stack_ffffffffffffffa8,(qsizetype)this,(Initialization)((ulong)in_RDI >> 0x20));
  local_20 = QByteArray::data(in_stack_ffffffffffffff80);
  local_38 = QByteArray::constData((QByteArray *)0x8f479c);
  qVar3 = QByteArray::size(in_RSI);
  pcVar4 = local_38 + qVar3;
  for (; local_38 < pcVar4; local_38 = local_38 + 1) {
    pcVar5 = local_38;
    if ((*local_38 == '\\') && (pcVar5 = local_38 + 1, pcVar5 < pcVar4)) {
      if (*pcVar5 == 'x') {
        local_41 = '\0';
        local_38 = pcVar5;
        for (local_48 = 0; local_48 < 2 && local_38 + 1 < pcVar4; local_48 = local_48 + 1) {
          local_38 = local_38 + 1;
          iVar2 = QtMiscUtils::fromHex((int)*local_38);
          if (iVar2 != -1) {
            local_41 = local_41 * '\x10' + (char)iVar2;
          }
        }
        *local_20 = local_41;
      }
      else {
        bVar1 = QtMiscUtils::isOctalDigit((int)*pcVar5);
        if (bVar1) {
          local_4d = *pcVar5 + -0x30;
          if ((local_38 + 2 < pcVar4) &&
             (bVar1 = QtMiscUtils::isOctalDigit((int)local_38[2]), bVar1)) {
            pcVar5 = local_38 + 2;
            local_4d = local_4d * '\b' + local_38[2] + -0x30;
            if ((local_38 + 3 < pcVar4) &&
               ((bVar1 = QtMiscUtils::isOctalDigit((int)local_38[3]), bVar1 && (local_38[1] < '4')))
               ) {
              local_4d = local_4d * '\b' + local_38[3] + -0x30;
              pcVar5 = local_38 + 3;
            }
          }
          local_38 = pcVar5;
          *local_20 = local_4d;
        }
        else if (*pcVar5 == 'n') {
          *local_20 = '\n';
          local_38 = pcVar5;
        }
        else if (*pcVar5 == 'r') {
          *local_20 = '\r';
          local_38 = pcVar5;
        }
        else if (*pcVar5 == 't') {
          *local_20 = '\t';
          local_38 = pcVar5;
        }
        else {
          *local_20 = *pcVar5;
          local_38 = pcVar5;
        }
      }
    }
    else {
      local_38 = pcVar5;
      *local_20 = *local_38;
    }
    local_20 = local_20 + 1;
  }
  pcVar4 = QByteArray::data(in_stack_ffffffffffffff80);
  QByteArray::truncate(this,local_20 + -(long)pcVar4,__length);
  return in_RDI;
}

Assistant:

static inline QByteArray makePattern(const QByteArray &value)
{
    QByteArray pattern(value.size(), Qt::Uninitialized);
    char *data = pattern.data();

    const char *p = value.constData();
    const char *e = p + value.size();
    for ( ; p < e; ++p) {
        if (*p == '\\' && ++p < e) {
            if (*p == 'x') { // hex (\\xff)
                char c = 0;
                for (int i = 0; i < 2 && p + 1 < e; ++i) {
                    ++p;
                    if (const int h = fromHex(*p); h != -1)
                        c = (c << 4) + h;
                    else
                        continue;
                }
                *data++ = c;
            } else if (isOctalDigit(*p)) { // oct (\\7, or \\77, or \\377)
                char c = *p - '0';
                if (p + 1 < e && isOctalDigit(p[1])) {
                    c = (c << 3) + *(++p) - '0';
                    if (p + 1 < e && isOctalDigit(p[1]) && p[-1] <= '3')
                        c = (c << 3) + *(++p) - '0';
                }
                *data++ = c;
            } else if (*p == 'n') {
                *data++ = '\n';
            } else if (*p == 'r') {
                *data++ = '\r';
            } else if (*p == 't') {
                *data++ = '\t';
            } else { // escaped
                *data++ = *p;
            }
        } else {
            *data++ = *p;
        }
    }
    pattern.truncate(data - pattern.data());

    return pattern;
}